

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int decodeDpcm(string *in_file_path,uchar *dpcm,int dpcm_frames,int dpcm_initial_volume,
              int bias_level,bool outputToFile,double dst_rate)

{
  byte bVar1;
  byte bVar2;
  StkFloat *pSVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  allocator local_a1;
  string local_a0 [48];
  int local_70;
  int local_6c;
  int i;
  int now_sample;
  StkFrames decode_sample;
  int volume_max;
  double dst_rate_local;
  bool outputToFile_local;
  int bias_level_local;
  int dpcm_initial_volume_local;
  int dpcm_frames_local;
  uchar *dpcm_local;
  string *in_file_path_local;
  
  decode_sample.bufferSize_._4_4_ = 0;
  stk::StkFrames::StkFrames((StkFrames *)&i,dpcm_frames,1);
  local_6c = dpcm_initial_volume;
  for (local_70 = 0; local_70 < dpcm_frames; local_70 = local_70 + 1) {
    iVar4 = local_70;
    if (local_70 < 0) {
      iVar4 = local_70 + 7;
    }
    bVar1 = dpcm[iVar4 >> 3];
    bVar2 = dpcmBitMask(local_70);
    if ((bVar1 & bVar2) == 0) {
      if (1 < local_6c) {
        local_6c = local_6c + -2;
      }
    }
    else if (local_6c < 0x7e) {
      local_6c = local_6c + 2;
    }
    if (decode_sample.bufferSize_._4_4_ < local_6c) {
      decode_sample.bufferSize_._4_4_ = local_6c;
    }
    dVar5 = linearToDacCurve((double)local_6c);
    dVar6 = linearToDacCurve((double)bias_level);
    pSVar3 = stk::StkFrames::operator[]((StkFrames *)&i,(long)local_70);
    *pSVar3 = dVar5 - dVar6;
  }
  if (outputToFile) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"_dpcm",&local_a1);
    outputBufferToFile(in_file_path,(StkFrames *)&i,(string *)local_a0,dst_rate);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  iVar4 = decode_sample.bufferSize_._4_4_;
  stk::StkFrames::~StkFrames((StkFrames *)&i);
  return iVar4;
}

Assistant:

int decodeDpcm(const std::string &in_file_path, const unsigned char *dpcm,
			   int dpcm_frames, int dpcm_initial_volume, int bias_level, bool outputToFile,
			   double dst_rate)
{
	int volume_max = 0;
	
	stk::StkFrames decode_sample(dpcm_frames, 1);
	int now_sample = dpcm_initial_volume;
	for (int i=0; i<dpcm_frames; ++i) {
		if (dpcm[i / 8] & dpcmBitMask(i)) {
			if (now_sample <= 125) {
				now_sample += 2;
			}
		}
		else {
			if (now_sample >= 2) {
				now_sample -= 2;
			}
		}
		
		if (volume_max < now_sample) {
			volume_max = now_sample;
		}
		
		// 実機非線形特性
		decode_sample[i] = linearToDacCurve(now_sample) - linearToDacCurve(bias_level);
	}
	if (outputToFile) {
		outputBufferToFile(in_file_path, decode_sample, "_dpcm", dst_rate);
	}
	
	return volume_max;
}